

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall Catch::ConsoleReporter::printOpenHeader(ConsoleReporter *this,string *_name)

{
  ulong in_RAX;
  ostream *poVar1;
  ulong uStack_18;
  Colour colourGuard;
  
  if (getLineOfChars<(char)45>()::line == '\0') {
    uRam000000000017ffa0 = 0x2d2d2d2d2d2d2d;
    uRam000000000017ffa7._0_1_ = '-';
    uRam000000000017ffa7._1_1_ = '-';
    uRam000000000017ffa7._2_1_ = '-';
    uRam000000000017ffa7._3_1_ = '-';
    uRam000000000017ffa7._4_1_ = '-';
    uRam000000000017ffa7._5_1_ = '-';
    uRam000000000017ffa7._6_1_ = '-';
    uRam000000000017ffa7._7_1_ = '-';
    DAT_0017ff90 = '-';
    DAT_0017ff90_1._0_1_ = '-';
    DAT_0017ff90_1._1_1_ = '-';
    DAT_0017ff90_1._2_1_ = '-';
    DAT_0017ff90_1._3_1_ = '-';
    DAT_0017ff90_1._4_1_ = '-';
    DAT_0017ff90_1._5_1_ = '-';
    DAT_0017ff90_1._6_1_ = '-';
    uRam000000000017ff98 = 0x2d2d2d2d2d2d2d;
    DAT_0017ff9f = 0x2d;
    DAT_0017ff80 = '-';
    DAT_0017ff80_1._0_1_ = '-';
    DAT_0017ff80_1._1_1_ = '-';
    DAT_0017ff80_1._2_1_ = '-';
    DAT_0017ff80_1._3_1_ = '-';
    DAT_0017ff80_1._4_1_ = '-';
    DAT_0017ff80_1._5_1_ = '-';
    DAT_0017ff80_1._6_1_ = '-';
    uRam000000000017ff88._0_1_ = '-';
    uRam000000000017ff88._1_1_ = '-';
    uRam000000000017ff88._2_1_ = '-';
    uRam000000000017ff88._3_1_ = '-';
    uRam000000000017ff88._4_1_ = '-';
    uRam000000000017ff88._5_1_ = '-';
    uRam000000000017ff88._6_1_ = '-';
    uRam000000000017ff88._7_1_ = '-';
    DAT_0017ff70 = '-';
    DAT_0017ff70_1._0_1_ = '-';
    DAT_0017ff70_1._1_1_ = '-';
    DAT_0017ff70_1._2_1_ = '-';
    DAT_0017ff70_1._3_1_ = '-';
    DAT_0017ff70_1._4_1_ = '-';
    DAT_0017ff70_1._5_1_ = '-';
    DAT_0017ff70_1._6_1_ = '-';
    uRam000000000017ff78._0_1_ = '-';
    uRam000000000017ff78._1_1_ = '-';
    uRam000000000017ff78._2_1_ = '-';
    uRam000000000017ff78._3_1_ = '-';
    uRam000000000017ff78._4_1_ = '-';
    uRam000000000017ff78._5_1_ = '-';
    uRam000000000017ff78._6_1_ = '-';
    uRam000000000017ff78._7_1_ = '-';
    getLineOfChars<(char)45>()::line = '-';
    getLineOfChars<(char)45>()::line_1._0_1_ = '-';
    getLineOfChars<(char)45>()::line_1._1_1_ = '-';
    getLineOfChars<(char)45>()::line_1._2_1_ = '-';
    getLineOfChars<(char)45>()::line_1._3_1_ = '-';
    getLineOfChars<(char)45>()::line_1._4_1_ = '-';
    getLineOfChars<(char)45>()::line_1._5_1_ = '-';
    getLineOfChars<(char)45>()::line_1._6_1_ = '-';
    uRam000000000017ff68._0_1_ = '-';
    uRam000000000017ff68._1_1_ = '-';
    uRam000000000017ff68._2_1_ = '-';
    uRam000000000017ff68._3_1_ = '-';
    uRam000000000017ff68._4_1_ = '-';
    uRam000000000017ff68._5_1_ = '-';
    uRam000000000017ff68._6_1_ = '-';
    uRam000000000017ff68._7_1_ = '-';
    DAT_0017ffaf = 0;
  }
  uStack_18 = in_RAX;
  poVar1 = std::operator<<((ostream *)
                           (this->super_StreamingReporterBase<Catch::ConsoleReporter>).stream,
                           &getLineOfChars<(char)45>()::line);
  std::operator<<(poVar1,'\n');
  uStack_18 = uStack_18 & 0xffffffffffffff;
  Colour::use(Headers);
  printHeaderString(this,_name,0);
  Colour::~Colour(&colourGuard);
  return;
}

Assistant:

void ConsoleReporter::printOpenHeader(std::string const& _name) {
    stream << getLineOfChars<'-'>() << '\n';
    {
        Colour colourGuard(Colour::Headers);
        printHeaderString(_name);
    }
}